

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Button.H
# Opt level: O3

void __thiscall Fl_Menu_Button::~Fl_Menu_Button(Fl_Menu_Button *this)

{
  Fl_Menu_::~Fl_Menu_(&this->super_Fl_Menu_);
  operator_delete(this,0x98);
  return;
}

Assistant:

class FL_EXPORT Fl_Menu_Button : public Fl_Menu_ {
protected:
  void draw();
public:
  /**
   \brief indicate what mouse buttons pop up the menu.
   
   Values for type() used to indicate what mouse buttons pop up the menu. 
   Fl_Menu_Button::POPUP3 is usually what you want.
   */  
  enum popup_buttons {POPUP1 = 1, /**< pops up with the mouse 1st button. */
    POPUP2,  /**< pops up with the mouse 2nd button. */
    POPUP12, /**< pops up with the mouse 1st or 2nd buttons. */
    POPUP3,   /**< pops up with the mouse 3rd button. */
    POPUP13,  /**< pops up with the mouse 1st or 3rd buttons. */
    POPUP23,  /**< pops up with the mouse 2nd or 3rd buttons. */
    POPUP123 /**< pops up with any mouse button. */
  };
  int handle(int);
  const Fl_Menu_Item* popup();
  Fl_Menu_Button(int,int,int,int,const char * =0);
}